

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_reference_expression.cpp
# Opt level: O3

void __thiscall
duckdb::BoundReferenceExpression::BoundReferenceExpression
          (BoundReferenceExpression *this,LogicalType *type,storage_t index)

{
  LogicalType LStack_58;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  LogicalType::LogicalType(&LStack_58,type);
  BoundReferenceExpression(this,&local_40,&LStack_58,index);
  LogicalType::~LogicalType(&LStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

BoundReferenceExpression::BoundReferenceExpression(LogicalType type, storage_t index)
    : BoundReferenceExpression(string(), std::move(type), index) {
}